

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-select.c
# Opt level: O3

ssh_hash * sha256_select(ssh_hashalg *alg)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  byte bVar3;
  ssh_hash *psVar4;
  ssh_hashalg *psVar5;
  long lVar6;
  
  psVar5 = &ssh_sha256_ni;
  lVar6 = 0;
  while( true ) {
    puVar1 = (undefined8 *)psVar5->extra;
    if (*(char *)puVar1[1] == '\0') {
      bVar3 = (*(code *)*puVar1)();
      puVar2 = (undefined1 *)puVar1[1];
      puVar2[1] = bVar3;
      *puVar2 = 1;
    }
    else {
      bVar3 = ((char *)puVar1[1])[1] & 1;
    }
    if (bVar3 != 0) break;
    psVar5 = sha256_select::real_algs[lVar6 + 1];
    lVar6 = lVar6 + 1;
    if (lVar6 == 2) {
      __assert_fail("false && \"sha256_select ran off the end of its list\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha256-select.c"
                    ,0x24,"ssh_hash *sha256_select(const ssh_hashalg *)");
    }
  }
  psVar4 = (*psVar5->new)(psVar5);
  if (psVar4 != (ssh_hash *)0x0) {
    (*psVar4->vt->reset)(psVar4);
  }
  return psVar4;
}

Assistant:

static ssh_hash *sha256_select(const ssh_hashalg *alg)
{
    static const ssh_hashalg *const real_algs[] = {
#if HAVE_SHA_NI
        &ssh_sha256_ni,
#endif
#if HAVE_NEON_CRYPTO
        &ssh_sha256_neon,
#endif
        &ssh_sha256_sw,
        NULL,
    };

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_hashalg *alg = real_algs[i];
        const struct sha256_extra *alg_extra =
            (const struct sha256_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_hash_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only SHA-256, which
     * is always available. */
    unreachable("sha256_select ran off the end of its list");
}